

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O1

Result<bilingual_str> *
result_tests::StrFn(Result<bilingual_str> *__return_storage_ptr__,bilingual_str s,bool success)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type sVar5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  int in_EDX;
  undefined7 in_register_00000031;
  bilingual_str *fmt;
  long in_FS_OFFSET;
  long *local_110;
  long local_108;
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  bilingual_str local_b0;
  ulong *local_70;
  undefined8 local_68;
  ulong local_60;
  undefined8 uStack_58;
  ulong *local_50;
  undefined8 local_48;
  ulong local_40;
  undefined8 uStack_38;
  long local_30;
  
  fmt = (bilingual_str *)CONCAT71(in_register_00000031,success);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX == 0) {
    local_110 = local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"str %s error.","");
    local_f0[0] = local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_f0,local_110,local_108 + (long)local_110);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,local_110,local_108 + (long)local_110);
    tinyformat::format<std::__cxx11::string>(&local_b0,(tinyformat *)local_f0,fmt,in_RCX);
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_bilingual_str>.
                     super__Move_assign_alias<bilingual_str,_bilingual_str>.
                     super__Copy_assign_alias<bilingual_str,_bilingual_str>.
                     super__Move_ctor_alias<bilingual_str,_bilingual_str>.
                     super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
                     super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_bilingual_str>.
      super__Move_assign_alias<bilingual_str,_bilingual_str>.
      super__Copy_assign_alias<bilingual_str,_bilingual_str>.
      super__Move_ctor_alias<bilingual_str,_bilingual_str>.
      super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
      super__Variant_storage_alias<bilingual_str,_bilingual_str> = puVar2;
    paVar1 = &local_b0.original.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.original._M_dataplus._M_p == paVar1) {
      *puVar2 = CONCAT71(local_b0.original.field_2._M_allocated_capacity._1_7_,
                         local_b0.original.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_bilingual_str>
               .super__Move_assign_alias<bilingual_str,_bilingual_str>.
               super__Copy_assign_alias<bilingual_str,_bilingual_str>.
               super__Move_ctor_alias<bilingual_str,_bilingual_str>.
               super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
               super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x18) =
           local_b0.original.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_bilingual_str>.
        super__Move_assign_alias<bilingual_str,_bilingual_str>.
        super__Copy_assign_alias<bilingual_str,_bilingual_str>.
        super__Move_ctor_alias<bilingual_str,_bilingual_str>.
        super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
        super__Variant_storage_alias<bilingual_str,_bilingual_str> =
           local_b0.original._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_bilingual_str>.
                        super__Move_assign_alias<bilingual_str,_bilingual_str>.
                        super__Copy_assign_alias<bilingual_str,_bilingual_str>.
                        super__Move_ctor_alias<bilingual_str,_bilingual_str>.
                        super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
                        super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x10) =
           CONCAT71(local_b0.original.field_2._M_allocated_capacity._1_7_,
                    local_b0.original.field_2._M_local_buf[0]);
    }
    paVar4 = &local_b0.translated.field_2;
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_bilingual_str>.
             super__Move_assign_alias<bilingual_str,_bilingual_str>.
             super__Copy_assign_alias<bilingual_str,_bilingual_str>.
             super__Move_ctor_alias<bilingual_str,_bilingual_str>.
             super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
             super__Variant_storage_alias<bilingual_str,_bilingual_str> + 8) =
         local_b0.original._M_string_length;
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_bilingual_str>.
                     super__Move_assign_alias<bilingual_str,_bilingual_str>.
                     super__Copy_assign_alias<bilingual_str,_bilingual_str>.
                     super__Move_ctor_alias<bilingual_str,_bilingual_str>.
                     super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
                     super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_bilingual_str>.
             super__Move_assign_alias<bilingual_str,_bilingual_str>.
             super__Copy_assign_alias<bilingual_str,_bilingual_str>.
             super__Move_ctor_alias<bilingual_str,_bilingual_str>.
             super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
             super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x20) = puVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.translated._M_dataplus._M_p == paVar4) {
      *puVar2 = CONCAT71(local_b0.translated.field_2._M_allocated_capacity._1_7_,
                         local_b0.translated.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_bilingual_str>
               .super__Move_assign_alias<bilingual_str,_bilingual_str>.
               super__Copy_assign_alias<bilingual_str,_bilingual_str>.
               super__Move_ctor_alias<bilingual_str,_bilingual_str>.
               super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
               super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x38) =
           local_b0.translated.field_2._8_8_;
    }
    else {
      *(pointer *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_bilingual_str>
               .super__Move_assign_alias<bilingual_str,_bilingual_str>.
               super__Copy_assign_alias<bilingual_str,_bilingual_str>.
               super__Move_ctor_alias<bilingual_str,_bilingual_str>.
               super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
               super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x20) =
           local_b0.translated._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_bilingual_str>.
                        super__Move_assign_alias<bilingual_str,_bilingual_str>.
                        super__Copy_assign_alias<bilingual_str,_bilingual_str>.
                        super__Move_ctor_alias<bilingual_str,_bilingual_str>.
                        super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
                        super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x30) =
           CONCAT71(local_b0.translated.field_2._M_allocated_capacity._1_7_,
                    local_b0.translated.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_bilingual_str>.
             super__Move_assign_alias<bilingual_str,_bilingual_str>.
             super__Copy_assign_alias<bilingual_str,_bilingual_str>.
             super__Move_ctor_alias<bilingual_str,_bilingual_str>.
             super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
             super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x28) =
         local_b0.translated._M_string_length;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_bilingual_str>.
             super__Move_assign_alias<bilingual_str,_bilingual_str>.
             super__Copy_assign_alias<bilingual_str,_bilingual_str>.
             super__Move_ctor_alias<bilingual_str,_bilingual_str>.
             super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
             super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x40) = '\0';
    local_b0.translated.field_2._M_local_buf[0] = '\0';
    local_b0.translated._M_string_length = 0;
    local_b0.original.field_2._M_local_buf[0] = '\0';
    local_b0.original._M_string_length = 0;
    local_b0.original._M_dataplus._M_p = (pointer)paVar1;
    local_b0.translated._M_dataplus._M_p = (pointer)paVar4;
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    if (local_f0[0] != local_e0) {
      operator_delete(local_f0[0],local_e0[0] + 1);
    }
    if (local_110 != local_100) {
      operator_delete(local_110,local_100[0] + 1);
    }
  }
  else {
    local_70 = (ulong *)(fmt->original)._M_dataplus._M_p;
    paVar1 = &(fmt->original).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70 == paVar1) {
      local_60 = paVar1->_M_allocated_capacity;
      uStack_58 = *(undefined8 *)((long)&(fmt->original).field_2 + 8);
      local_70 = &local_60;
    }
    else {
      local_60 = paVar1->_M_allocated_capacity;
    }
    sVar5 = (fmt->original)._M_string_length;
    (fmt->original)._M_dataplus._M_p = (pointer)paVar1;
    (fmt->original)._M_string_length = 0;
    (fmt->original).field_2._M_local_buf[0] = '\0';
    local_50 = (ulong *)(fmt->translated)._M_dataplus._M_p;
    paVar1 = &(fmt->translated).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50 == paVar1) {
      local_40 = paVar1->_M_allocated_capacity;
      uStack_38 = *(undefined8 *)((long)&(fmt->translated).field_2 + 8);
      local_50 = &local_40;
    }
    else {
      local_40 = paVar1->_M_allocated_capacity;
    }
    sVar6 = (fmt->translated)._M_string_length;
    (fmt->translated)._M_dataplus._M_p = (pointer)paVar1;
    (fmt->translated)._M_string_length = 0;
    (fmt->translated).field_2._M_local_buf[0] = '\0';
    puVar3 = (ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_bilingual_str>.
                              super__Move_assign_alias<bilingual_str,_bilingual_str>.
                              super__Copy_assign_alias<bilingual_str,_bilingual_str>.
                              super__Move_ctor_alias<bilingual_str,_bilingual_str>.
                              super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
                              super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x10);
    *(ulong **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_bilingual_str>.
      super__Move_assign_alias<bilingual_str,_bilingual_str>.
      super__Copy_assign_alias<bilingual_str,_bilingual_str>.
      super__Move_ctor_alias<bilingual_str,_bilingual_str>.
      super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
      super__Variant_storage_alias<bilingual_str,_bilingual_str> = puVar3;
    if (local_70 == &local_60) {
      *puVar3 = local_60;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_bilingual_str>
               .super__Move_assign_alias<bilingual_str,_bilingual_str>.
               super__Copy_assign_alias<bilingual_str,_bilingual_str>.
               super__Move_ctor_alias<bilingual_str,_bilingual_str>.
               super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
               super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x18) = uStack_58;
    }
    else {
      *(ulong **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_bilingual_str>.
        super__Move_assign_alias<bilingual_str,_bilingual_str>.
        super__Copy_assign_alias<bilingual_str,_bilingual_str>.
        super__Move_ctor_alias<bilingual_str,_bilingual_str>.
        super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
        super__Variant_storage_alias<bilingual_str,_bilingual_str> = local_70;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_bilingual_str>.
                        super__Move_assign_alias<bilingual_str,_bilingual_str>.
                        super__Copy_assign_alias<bilingual_str,_bilingual_str>.
                        super__Move_ctor_alias<bilingual_str,_bilingual_str>.
                        super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
                        super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x10) =
           local_60;
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_bilingual_str>.
             super__Move_assign_alias<bilingual_str,_bilingual_str>.
             super__Copy_assign_alias<bilingual_str,_bilingual_str>.
             super__Move_ctor_alias<bilingual_str,_bilingual_str>.
             super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
             super__Variant_storage_alias<bilingual_str,_bilingual_str> + 8) = sVar5;
    local_68 = 0;
    local_60 = local_60 & 0xffffffffffffff00;
    puVar3 = (ulong *)((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_bilingual_str>.
                              super__Move_assign_alias<bilingual_str,_bilingual_str>.
                              super__Copy_assign_alias<bilingual_str,_bilingual_str>.
                              super__Move_ctor_alias<bilingual_str,_bilingual_str>.
                              super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
                              super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x30);
    *(ulong **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_bilingual_str>.
             super__Move_assign_alias<bilingual_str,_bilingual_str>.
             super__Copy_assign_alias<bilingual_str,_bilingual_str>.
             super__Move_ctor_alias<bilingual_str,_bilingual_str>.
             super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
             super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x20) = puVar3;
    if (local_50 == &local_40) {
      *puVar3 = local_40;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_bilingual_str>
               .super__Move_assign_alias<bilingual_str,_bilingual_str>.
               super__Copy_assign_alias<bilingual_str,_bilingual_str>.
               super__Move_ctor_alias<bilingual_str,_bilingual_str>.
               super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
               super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x38) = uStack_38;
    }
    else {
      *(ulong **)
       ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_bilingual_str>
               .super__Move_assign_alias<bilingual_str,_bilingual_str>.
               super__Copy_assign_alias<bilingual_str,_bilingual_str>.
               super__Move_ctor_alias<bilingual_str,_bilingual_str>.
               super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
               super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x20) = local_50;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_bilingual_str>.
                        super__Move_assign_alias<bilingual_str,_bilingual_str>.
                        super__Copy_assign_alias<bilingual_str,_bilingual_str>.
                        super__Move_ctor_alias<bilingual_str,_bilingual_str>.
                        super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
                        super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x30) =
           local_40;
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_bilingual_str>.
             super__Move_assign_alias<bilingual_str,_bilingual_str>.
             super__Copy_assign_alias<bilingual_str,_bilingual_str>.
             super__Move_ctor_alias<bilingual_str,_bilingual_str>.
             super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
             super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x28) = sVar6;
    local_48 = 0;
    local_40 = local_40 & 0xffffffffffffff00;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_bilingual_str>.
             super__Move_assign_alias<bilingual_str,_bilingual_str>.
             super__Copy_assign_alias<bilingual_str,_bilingual_str>.
             super__Move_ctor_alias<bilingual_str,_bilingual_str>.
             super__Copy_ctor_alias<bilingual_str,_bilingual_str>.
             super__Variant_storage_alias<bilingual_str,_bilingual_str> + 0x40) = '\x01';
    local_70 = &local_60;
    local_50 = &local_40;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<bilingual_str> StrFn(bilingual_str s, bool success)
{
    if (success) return s;
    return util::Error{strprintf(Untranslated("str %s error."), s.original)};
}